

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

void free_node(_node_t *n)

{
  _node_t *n_00;
  uint i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < n->num_children; uVar1 = uVar1 + 1) {
    n_00 = n->children[uVar1];
    if (n_00 != (_node_t *)0x0) {
      free_node(n_00);
    }
  }
  free(n->children);
  free(n);
  return;
}

Assistant:

void free_node(_node_t* n)
{
    unsigned int i;
    for (i = 0; i < n->num_children; i++)
    {
        if (n->children[i])
            free_node(n->children[i]);
    }

    if (n->children)
        free(n->children);

    free(n);
}